

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O2

void CSOAA::global_print_newline(vw *all)

{
  ssize_t sVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  size_t i;
  ulong uVar5;
  char temp [1];
  
  for (uVar5 = 0; piVar3 = (all->final_prediction_sink)._begin,
      uVar5 < (ulong)((long)(all->final_prediction_sink)._end - (long)piVar3 >> 2);
      uVar5 = uVar5 + 1) {
    sVar1 = io_buf::write_file_or_socket(piVar3[uVar5],temp,1);
    if (sVar1 != 1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"write error: ");
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      poVar2 = std::operator<<(poVar2,pcVar4);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  return;
}

Assistant:

void global_print_newline(vw& all)
{
  char temp[1];
  temp[0] = '\n';
  for (size_t i = 0; i < all.final_prediction_sink.size(); i++)
  {
    int f = all.final_prediction_sink[i];
    ssize_t t;
    t = io_buf::write_file_or_socket(f, temp, 1);
    if (t != 1)
      cerr << "write error: " << strerror(errno) << endl;
  }
}